

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O3

void ggml_compute_forward_step(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  ggml_type gVar3;
  int iVar4;
  int iVar5;
  ggml_tensor *pgVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  void *pvVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  ulong uVar30;
  uint uVar31;
  byte bVar32;
  byte bVar33;
  char cVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  char *pcVar40;
  long lVar41;
  int64_t nth;
  ushort uVar42;
  undefined8 uVar43;
  int64_t ir;
  long lVar44;
  long lVar45;
  ggml_tensor *src0;
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  anon_union_4_2_947300a4 u;
  undefined1 auVar53 [16];
  undefined1 auVar46 [32];
  
  pgVar6 = dst->src[0];
  gVar2 = dst->type;
  gVar3 = pgVar6->type;
  if (gVar3 == GGML_TYPE_BF16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar34 = ggml_is_contiguous_1(pgVar6);
      if (((cVar34 != '\0') && (cVar34 = ggml_is_contiguous_1(dst), cVar34 != '\0')) &&
         (cVar34 = ggml_are_same_shape(pgVar6,dst), cVar34 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar6->nb[0] == 2) {
            sVar7 = pgVar6->nb[2];
            sVar8 = pgVar6->nb[3];
            sVar9 = pgVar6->nb[1];
            lVar10 = pgVar6->ne[1];
            lVar45 = pgVar6->ne[2];
            lVar11 = dst->ne[0];
            sVar12 = dst->nb[1];
            sVar13 = dst->nb[2];
            sVar14 = dst->nb[3];
            iVar4 = params->ith;
            iVar5 = params->nth;
            lVar35 = ggml_nrows(pgVar6);
            lVar36 = ((long)iVar5 + -1 + lVar35) / (long)iVar5;
            lVar44 = iVar4 * lVar36;
            lVar36 = lVar36 + lVar44;
            if (lVar35 <= lVar36) {
              lVar36 = lVar35;
            }
            if (lVar44 < lVar36) {
              auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              pvVar15 = pgVar6->data;
              lVar45 = lVar45 * lVar10;
              pvVar16 = dst->data;
              auVar50 = vpbroadcastq_avx512f();
              do {
                lVar35 = lVar44 / lVar45;
                lVar41 = lVar44 % lVar45;
                lVar37 = lVar41 / lVar10;
                lVar41 = lVar41 % lVar10;
                if (0 < lVar11) {
                  uVar39 = 0;
                  do {
                    auVar51 = vpbroadcastq_avx512f();
                    auVar52 = vporq_avx512f(auVar51,auVar48);
                    auVar51 = vporq_avx512f(auVar51,auVar49);
                    uVar43 = vpcmpuq_avx512f(auVar51,auVar50,2);
                    bVar32 = (byte)uVar43;
                    uVar43 = vpcmpuq_avx512f(auVar52,auVar50,2);
                    bVar33 = (byte)uVar43;
                    uVar42 = CONCAT11(bVar33,bVar32);
                    auVar46 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                  ((long)pvVar15 +
                                                  uVar39 * 2 +
                                                  lVar37 * sVar7 + lVar41 * sVar9 + lVar35 * sVar8))
                    ;
                    auVar47._2_2_ = (ushort)((byte)(uVar42 >> 1) & 1) * auVar46._2_2_;
                    auVar47._0_2_ = (ushort)(bVar32 & 1) * auVar46._0_2_;
                    auVar47._4_2_ = (ushort)((byte)(uVar42 >> 2) & 1) * auVar46._4_2_;
                    auVar47._6_2_ = (ushort)((byte)(uVar42 >> 3) & 1) * auVar46._6_2_;
                    auVar47._8_2_ = (ushort)((byte)(uVar42 >> 4) & 1) * auVar46._8_2_;
                    auVar47._10_2_ = (ushort)((byte)(uVar42 >> 5) & 1) * auVar46._10_2_;
                    auVar47._12_2_ = (ushort)((byte)(uVar42 >> 6) & 1) * auVar46._12_2_;
                    auVar47._14_2_ = (ushort)((byte)(uVar42 >> 7) & 1) * auVar46._14_2_;
                    auVar47._16_2_ = (ushort)(bVar33 & 1) * auVar46._16_2_;
                    auVar47._18_2_ = (ushort)(bVar33 >> 1 & 1) * auVar46._18_2_;
                    auVar47._20_2_ = (ushort)(bVar33 >> 2 & 1) * auVar46._20_2_;
                    auVar47._22_2_ = (ushort)(bVar33 >> 3 & 1) * auVar46._22_2_;
                    auVar47._24_2_ = (ushort)(bVar33 >> 4 & 1) * auVar46._24_2_;
                    auVar47._26_2_ = (ushort)(bVar33 >> 5 & 1) * auVar46._26_2_;
                    auVar47._28_2_ = (ushort)(bVar33 >> 6 & 1) * auVar46._28_2_;
                    auVar47._30_2_ = (ushort)(bVar33 >> 7) * auVar46._30_2_;
                    auVar51 = vpmovzxwd_avx512f(auVar47);
                    auVar51 = vpslld_avx512f(auVar51,0x10);
                    uVar30 = vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar51,1);
                    auVar51 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                    puVar1 = (uint *)((long)pvVar16 +
                                     uVar39 * 4 +
                                     lVar37 * sVar13 + lVar41 * sVar12 + lVar35 * sVar14);
                    bVar17 = (bool)((byte)(uVar42 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar42 >> 2) & 1);
                    bVar19 = (bool)((byte)(uVar42 >> 3) & 1);
                    bVar20 = (bool)((byte)(uVar42 >> 4) & 1);
                    bVar21 = (bool)((byte)(uVar42 >> 5) & 1);
                    bVar22 = (bool)((byte)(uVar42 >> 6) & 1);
                    bVar23 = (bool)((byte)(uVar42 >> 7) & 1);
                    bVar24 = (bool)(bVar33 >> 1 & 1);
                    bVar25 = (bool)(bVar33 >> 2 & 1);
                    bVar26 = (bool)(bVar33 >> 3 & 1);
                    bVar27 = (bool)(bVar33 >> 4 & 1);
                    bVar28 = (bool)(bVar33 >> 5 & 1);
                    bVar29 = (bool)(bVar33 >> 6 & 1);
                    *puVar1 = (uint)(bVar32 & 1) * (uint)((byte)uVar30 & 1) * auVar51._0_4_ |
                              (uint)!(bool)(bVar32 & 1) * *puVar1;
                    puVar1[1] = (uint)bVar17 * (uint)((byte)(uVar30 >> 1) & 1) * auVar51._4_4_ |
                                (uint)!bVar17 * puVar1[1];
                    puVar1[2] = (uint)bVar18 * (uint)((byte)(uVar30 >> 2) & 1) * auVar51._8_4_ |
                                (uint)!bVar18 * puVar1[2];
                    puVar1[3] = (uint)bVar19 * (uint)((byte)(uVar30 >> 3) & 1) * auVar51._12_4_ |
                                (uint)!bVar19 * puVar1[3];
                    puVar1[4] = (uint)bVar20 * (uint)((byte)(uVar30 >> 4) & 1) * auVar51._16_4_ |
                                (uint)!bVar20 * puVar1[4];
                    puVar1[5] = (uint)bVar21 * (uint)((byte)(uVar30 >> 5) & 1) * auVar51._20_4_ |
                                (uint)!bVar21 * puVar1[5];
                    puVar1[6] = (uint)bVar22 * (uint)((byte)(uVar30 >> 6) & 1) * auVar51._24_4_ |
                                (uint)!bVar22 * puVar1[6];
                    puVar1[7] = (uint)bVar23 * (uint)((byte)(uVar30 >> 7) & 1) * auVar51._28_4_ |
                                (uint)!bVar23 * puVar1[7];
                    puVar1[8] = (uint)(bVar33 & 1) *
                                (uint)((byte)(uVar30 >> 8) & 1) * auVar51._32_4_ |
                                (uint)!(bool)(bVar33 & 1) * puVar1[8];
                    puVar1[9] = (uint)bVar24 * (uint)((byte)(uVar30 >> 9) & 1) * auVar51._36_4_ |
                                (uint)!bVar24 * puVar1[9];
                    puVar1[10] = (uint)bVar25 * (uint)((byte)(uVar30 >> 10) & 1) * auVar51._40_4_ |
                                 (uint)!bVar25 * puVar1[10];
                    puVar1[0xb] = (uint)bVar26 * (uint)((byte)(uVar30 >> 0xb) & 1) * auVar51._44_4_
                                  | (uint)!bVar26 * puVar1[0xb];
                    puVar1[0xc] = (uint)bVar27 * (uint)((byte)(uVar30 >> 0xc) & 1) * auVar51._48_4_
                                  | (uint)!bVar27 * puVar1[0xc];
                    puVar1[0xd] = (uint)bVar28 * (uint)((byte)(uVar30 >> 0xd) & 1) * auVar51._52_4_
                                  | (uint)!bVar28 * puVar1[0xd];
                    puVar1[0xe] = (uint)bVar29 * (uint)((byte)(uVar30 >> 0xe) & 1) * auVar51._56_4_
                                  | (uint)!bVar29 * puVar1[0xe];
                    puVar1[0xf] = (uint)(bVar33 >> 7) * (uint)(byte)(uVar30 >> 0xf) * auVar51._60_4_
                                  | (uint)!(bool)(bVar33 >> 7) * puVar1[0xf];
                    uVar39 = uVar39 + 0x10;
                  } while ((lVar11 + 0xfU & 0xfffffffffffffff0) != uVar39);
                }
                lVar44 = lVar44 + 1;
              } while (lVar44 != lVar36);
            }
            return;
          }
          goto LAB_0012a5f4;
        }
        goto LAB_0012a5d8;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_BF16) goto LAB_0012a5d0;
      cVar34 = ggml_is_contiguous_1(pgVar6);
      if (((cVar34 != '\0') && (cVar34 = ggml_is_contiguous_1(dst), cVar34 != '\0')) &&
         (cVar34 = ggml_are_same_shape(pgVar6,dst), cVar34 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012a5d8;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar45 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          sVar12 = dst->nb[1];
          sVar13 = dst->nb[2];
          sVar14 = dst->nb[3];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar35 = ggml_nrows(pgVar6);
          lVar36 = ((long)iVar5 + -1 + lVar35) / (long)iVar5;
          lVar44 = iVar4 * lVar36;
          lVar36 = lVar36 + lVar44;
          if (lVar35 <= lVar36) {
            lVar36 = lVar35;
          }
          if (lVar36 <= lVar44) {
            return;
          }
          pvVar15 = pgVar6->data;
          lVar45 = lVar45 * lVar10;
          pvVar16 = dst->data;
          do {
            lVar35 = lVar44 / lVar45;
            lVar41 = lVar44 % lVar45;
            lVar37 = lVar41 / lVar10;
            lVar41 = lVar41 % lVar10;
            if (0 < lVar11) {
              lVar38 = 0;
              do {
                uVar43 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                        ZEXT216(*(ushort *)
                                                 ((long)pvVar15 +
                                                 lVar38 * 2 +
                                                 lVar37 * sVar7 + lVar41 * sVar9 + lVar35 * sVar8))
                                        << 0x10,1);
                uVar31 = (uint)((byte)uVar43 & 1) * 0x3f800000;
                if (uVar31 < 0x7f800001) {
                  uVar42 = (ushort)(uVar31 + 0x7fff >> 0x10);
                }
                else {
                  uVar42 = (ushort)(uVar31 >> 0x10) | 0x40;
                }
                *(ushort *)
                 ((long)pvVar16 + lVar38 * 2 + lVar37 * sVar13 + lVar41 * sVar12 + lVar35 * sVar14)
                     = uVar42;
                lVar38 = lVar38 + 1;
              } while (lVar11 != lVar38);
            }
            lVar44 = lVar44 + 1;
          } while (lVar44 != lVar36);
          return;
        }
        goto LAB_0012a5f4;
      }
    }
  }
  else if (gVar3 == GGML_TYPE_F16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar34 = ggml_is_contiguous_1(pgVar6);
      if (((cVar34 != '\0') && (cVar34 = ggml_is_contiguous_1(dst), cVar34 != '\0')) &&
         (cVar34 = ggml_are_same_shape(pgVar6,dst), cVar34 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_0012a5d8;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar45 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          sVar12 = dst->nb[3];
          sVar13 = dst->nb[1];
          sVar14 = dst->nb[2];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar35 = ggml_nrows(pgVar6);
          lVar36 = ((long)iVar5 + -1 + lVar35) / (long)iVar5;
          lVar44 = iVar4 * lVar36;
          lVar36 = lVar36 + lVar44;
          if (lVar35 <= lVar36) {
            lVar36 = lVar35;
          }
          if (lVar36 <= lVar44) {
            return;
          }
          lVar45 = lVar45 * lVar10;
          pvVar15 = dst->data;
          pvVar16 = pgVar6->data;
          do {
            lVar35 = lVar44 / lVar45;
            lVar41 = lVar44 % lVar45;
            lVar37 = lVar41 / lVar10;
            lVar41 = lVar41 % lVar10;
            if (0 < lVar11) {
              lVar38 = 0;
              do {
                uVar43 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                        ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                         (ulong)*(ushort *)
                                                                 ((long)pvVar16 +
                                                                 lVar38 * 2 +
                                                                 lVar37 * sVar7 +
                                                                 lVar41 * sVar9 + lVar35 * sVar8) *
                                                         4)),1);
                *(uint *)((long)pvVar15 +
                         lVar38 * 4 + lVar37 * sVar14 + lVar41 * sVar13 + lVar35 * sVar12) =
                     (uint)((byte)uVar43 & 1) * 0x3f800000;
                lVar38 = lVar38 + 1;
              } while (lVar11 != lVar38);
            }
            lVar44 = lVar44 + 1;
          } while (lVar44 != lVar36);
          return;
        }
LAB_0012a5f4:
        pcVar40 = "nb00 == sizeof(src0_t)";
        uVar43 = 0x56;
        goto LAB_0012a60e;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_F16) goto LAB_0012a5d0;
      cVar34 = ggml_is_contiguous_1(pgVar6);
      if (((cVar34 != '\0') && (cVar34 = ggml_is_contiguous_1(dst), cVar34 != '\0')) &&
         (cVar34 = ggml_are_same_shape(pgVar6,dst), cVar34 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012a5d8;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar45 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar35 = ggml_nrows(pgVar6);
          lVar36 = ((long)iVar5 + -1 + lVar35) / (long)iVar5;
          lVar44 = iVar4 * lVar36;
          lVar36 = lVar36 + lVar44;
          if (lVar35 <= lVar36) {
            lVar36 = lVar35;
          }
          if (lVar36 <= lVar44) {
            return;
          }
          lVar45 = lVar45 * lVar10;
          do {
            lVar35 = lVar44 % lVar45;
            if (0 < lVar11) {
              lVar37 = 0;
              do {
                uVar43 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                        ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                         (ulong)*(ushort *)
                                                                 ((long)pgVar6->data +
                                                                 lVar37 * 2 +
                                                                 (lVar35 / lVar10) * sVar7 +
                                                                 (lVar35 % lVar10) * sVar9 +
                                                                 (lVar44 / lVar45) * sVar8) * 4)),1)
                ;
                auVar53 = vcvtps2ph_f16c(ZEXT416((uint)((byte)uVar43 & 1) * 0x3f800000),0);
                vpextrw_avx(auVar53,0);
                lVar37 = lVar37 + 1;
              } while (lVar11 != lVar37);
            }
            lVar44 = lVar44 + 1;
          } while (lVar44 != lVar36);
          return;
        }
        goto LAB_0012a5f4;
      }
    }
  }
  else {
    if ((gVar3 != GGML_TYPE_F32) || (gVar2 != GGML_TYPE_F32)) {
LAB_0012a5d0:
      ggml_compute_forward_step_cold_1();
LAB_0012a5d8:
      pcVar40 = "nb0 == sizeof(dst_t)";
      uVar43 = 0x55;
      goto LAB_0012a60e;
    }
    cVar34 = ggml_is_contiguous_1(pgVar6);
    if (((cVar34 != '\0') && (cVar34 = ggml_is_contiguous_1(dst), cVar34 != '\0')) &&
       (cVar34 = ggml_are_same_shape(pgVar6,dst), cVar34 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012a5d8;
      if (pgVar6->nb[0] == 4) {
        sVar7 = pgVar6->nb[2];
        sVar8 = pgVar6->nb[1];
        sVar9 = pgVar6->nb[3];
        lVar10 = pgVar6->ne[1];
        lVar45 = pgVar6->ne[2];
        lVar11 = dst->ne[0];
        sVar12 = dst->nb[2];
        sVar13 = dst->nb[3];
        sVar14 = dst->nb[1];
        iVar4 = params->ith;
        iVar5 = params->nth;
        lVar35 = ggml_nrows(pgVar6);
        lVar36 = ((long)iVar5 + -1 + lVar35) / (long)iVar5;
        lVar44 = iVar4 * lVar36;
        lVar36 = lVar36 + lVar44;
        if (lVar35 <= lVar36) {
          lVar36 = lVar35;
        }
        if (lVar36 <= lVar44) {
          return;
        }
        lVar45 = lVar45 * lVar10;
        pvVar15 = dst->data;
        pvVar16 = pgVar6->data;
        do {
          lVar35 = lVar44 / lVar45;
          lVar41 = lVar44 % lVar45;
          lVar37 = lVar41 / lVar10;
          lVar41 = lVar41 % lVar10;
          if (0 < lVar11) {
            lVar38 = 0;
            do {
              uVar43 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                      ZEXT416(*(uint *)((long)pvVar16 +
                                                       lVar38 * 4 +
                                                       lVar37 * sVar7 +
                                                       lVar41 * sVar8 + lVar35 * sVar9)),1);
              *(uint *)((long)pvVar15 +
                       lVar38 * 4 + lVar37 * sVar12 + lVar41 * sVar14 + lVar35 * sVar13) =
                   (uint)((byte)uVar43 & 1) * 0x3f800000;
              lVar38 = lVar38 + 1;
            } while (lVar11 != lVar38);
          }
          lVar44 = lVar44 + 1;
        } while (lVar44 != lVar36);
        return;
      }
      goto LAB_0012a5f4;
    }
  }
  pcVar40 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar43 = 0x51;
LAB_0012a60e:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar43,"GGML_ASSERT(%s) failed",pcVar40);
}

Assistant:

void ggml_compute_forward_step(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_step>(params, dst);
}